

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keysections.cpp
# Opt level: O2

void M_SaveCustomKeys(FConfigFile *config,char *section,char *subsection,size_t sublen)

{
  long lVar1;
  uint i;
  ulong uVar2;
  
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < KeySections.Count; uVar2 = uVar2 + 1) {
    mysnprintf(subsection,sublen,"%s.Bindings");
    DoSaveKeys(config,section,(FKeySection *)((long)&((KeySections.Array)->mTitle).Chars + lVar1),
               false);
    mysnprintf(subsection,sublen,"%s.DoubleBindings",
               *(undefined8 *)((long)&((KeySections.Array)->mSection).Chars + lVar1));
    DoSaveKeys(config,section,(FKeySection *)((long)&((KeySections.Array)->mTitle).Chars + lVar1),
               true);
    lVar1 = lVar1 + 0x20;
  }
  return;
}

Assistant:

void M_SaveCustomKeys (FConfigFile *config, char *section, char *subsection, size_t sublen)
{
	for (unsigned i=0; i<KeySections.Size(); i++)
	{
		mysnprintf (subsection, sublen, "%s.Bindings", KeySections[i].mSection.GetChars());
		DoSaveKeys (config, section, &KeySections[i], false);
		mysnprintf (subsection, sublen, "%s.DoubleBindings", KeySections[i].mSection.GetChars());
		DoSaveKeys (config, section, &KeySections[i], true);
	}
}